

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.c
# Opt level: O3

void serial_try_write(Serial *serial)

{
  bufchain *ch;
  Seat *pSVar1;
  size_t sVar2;
  int *piVar3;
  ulong uVar4;
  ptrlen pVar5;
  
  if (serial->fd < 0) {
    __assert_fail("serial->fd >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/serial.c",
                  0x1b7,"void serial_try_write(Serial *)");
  }
  ch = &serial->output_data;
  do {
    sVar2 = bufchain_size(ch);
    if (sVar2 == 0) {
LAB_0013cac6:
      pSVar1 = serial->seat;
      sVar2 = bufchain_size(ch);
      (*pSVar1->vt->sent)(pSVar1,sVar2);
      serial_uxsel_setup(serial);
      return;
    }
    pVar5 = bufchain_prefix(ch);
    uVar4 = (ulong)(uint)serial->fd;
    sVar2 = write(serial->fd,pVar5.ptr,pVar5.len);
    if ((long)sVar2 < 0) {
      piVar3 = __errno_location();
      if (*piVar3 != 0xb) {
        serial_try_write_cold_1();
        if (-1 < *(int *)(uVar4 + 0x10)) {
          uxsel_del((int)((ulong)serial >> 0x20));
          close(*(int *)(uVar4 + 0x10));
          *(undefined4 *)(uVar4 + 0x10) = 0xffffffff;
        }
        return;
      }
      goto LAB_0013cac6;
    }
    bufchain_consume(ch,sVar2);
  } while( true );
}

Assistant:

static void serial_try_write(Serial *serial)
{
    ssize_t ret;

    assert(serial->fd >= 0);

    while (bufchain_size(&serial->output_data) > 0) {
        ptrlen data = bufchain_prefix(&serial->output_data);
        ret = write(serial->fd, data.ptr, data.len);

        if (ret < 0 && (errno == EWOULDBLOCK)) {
            /*
             * We've sent all we can for the moment.
             */
            break;
        }
        if (ret < 0) {
            perror("write serial port");
            exit(1);
        }
        bufchain_consume(&serial->output_data, ret);
    }

    seat_sent(serial->seat, bufchain_size(&serial->output_data));
    serial_uxsel_setup(serial);
}